

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O1

string * __thiscall
cppcms::filters::streamable::
to_string<cppcms::stream_it<cppcms::url_mapper::data,cppcms::url_mapper::data::entry>>
          (string *__return_storage_ptr__,streamable *this,ios *out,void *ptr)

{
  ostringstream oss;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ios::copyfmt((ios *)((ostringstream *)local_198 + *(long *)(local_198[0] + -0x18)));
  url_mapper::data::write
            (*(data **)out,(int)*(undefined8 *)(out + 8),*(void **)(out + 0x10),
             *(size_t *)(out + 0x18));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string(std::ios &out,void const *ptr)
			{
				T const *object=reinterpret_cast<T const *>(ptr);
				std::ostringstream oss;
				oss.copyfmt(out);
				oss << *object;
				return oss.str();
			}